

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O3

ActionMessage * __thiscall helics::ActionMessage::operator=(ActionMessage *this,ActionMessage *act)

{
  size_t size;
  int32_t iVar1;
  uint16_t uVar2;
  
  iVar1 = act->messageID;
  this->messageAction = act->messageAction;
  this->messageID = iVar1;
  (this->source_id).gid = (act->source_id).gid;
  (this->source_handle).hid = (act->source_handle).hid;
  (this->dest_id).gid = (act->dest_id).gid;
  (this->dest_handle).hid = (act->dest_handle).hid;
  uVar2 = act->flags;
  this->counter = act->counter;
  this->flags = uVar2;
  this->sequenceID = act->sequenceID;
  (this->actionTime).internalTimeCode = (act->actionTime).internalTimeCode;
  (this->Te).internalTimeCode = (act->Te).internalTimeCode;
  (this->Tdemin).internalTimeCode = (act->Tdemin).internalTimeCode;
  (this->Tso).internalTimeCode = (act->Tso).internalTimeCode;
  if (this != act) {
    size = (act->payload).bufferSize;
    SmallBuffer::reserve(&this->payload,size);
    (this->payload).bufferSize = size;
    memcpy((this->payload).heap,(act->payload).heap,(act->payload).bufferSize);
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->stringData,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&act->stringData);
  return this;
}

Assistant:

ActionMessage& ActionMessage::operator=(const ActionMessage& act)  // NOLINT
{
    messageAction = act.messageAction;
    messageID = act.messageID;
    source_id = act.source_id;
    source_handle = act.source_handle;
    dest_id = act.dest_id;
    dest_handle = act.dest_handle;
    counter = act.counter;
    flags = act.flags;
    sequenceID = act.sequenceID;
    actionTime = act.actionTime;
    Te = act.Te;
    Tdemin = act.Tdemin;
    Tso = act.Tso;
    payload = act.payload;
    stringData = act.stringData;
    return *this;
}